

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fmp4stream.cpp
# Opt level: O2

void __thiscall fmp4_stream::emsg::parse(emsg *this,char *ptr,uint data_size)

{
  ulong uVar1;
  size_type sVar2;
  uint uVar3;
  long lVar4;
  long lVar5;
  ulong uVar6;
  allocator local_51;
  string local_50 [32];
  
  full_box::parse(&this->super_full_box,ptr);
  uVar6 = (ulong)((uint)(this->super_full_box).super_box.has_uuid_ * 0x10 +
                 (uint)(this->super_full_box).super_box.is_large_ * 8);
  if ((this->super_full_box).super_box.field_0x62 == '\0') {
    std::__cxx11::string::string(local_50,ptr + uVar6 + 0xc,&local_51);
    std::__cxx11::string::operator=((string *)&this->scheme_id_uri_,local_50);
    std::__cxx11::string::~string(local_50);
    lVar5 = uVar6 + 8 + (this->scheme_id_uri_)._M_string_length;
    std::__cxx11::string::string(local_50,ptr + lVar5 + 5,&local_51);
    std::__cxx11::string::operator=((string *)&this->value_,local_50);
    std::__cxx11::string::~string(local_50);
    sVar2 = (this->value_)._M_string_length;
    lVar4 = sVar2 + lVar5;
    uVar3 = *(uint *)(ptr + lVar4 + 6);
    this->timescale_ =
         uVar3 >> 0x18 | (uVar3 & 0xff0000) >> 8 | (uVar3 & 0xff00) << 8 | uVar3 << 0x18;
    uVar3 = *(uint *)(ptr + lVar4 + 10);
    this->presentation_time_delta_ =
         uVar3 >> 0x18 | (uVar3 & 0xff0000) >> 8 | (uVar3 & 0xff00) << 8 | uVar3 << 0x18;
    uVar3 = *(uint *)(ptr + lVar4 + 0xe);
    this->event_duration_ =
         uVar3 >> 0x18 | (uVar3 & 0xff0000) >> 8 | (uVar3 & 0xff00) << 8 | uVar3 << 0x18;
    uVar3 = *(uint *)(ptr + lVar4 + 0x12);
    this->id_ = uVar3 >> 0x18 | (uVar3 & 0xff0000) >> 8 | (uVar3 & 0xff00) << 8 | uVar3 << 0x18;
    uVar3 = (int)sVar2 + (int)lVar5 + 0x16;
  }
  else {
    uVar3 = *(uint *)(ptr + uVar6 + 0xc);
    this->timescale_ =
         uVar3 >> 0x18 | (uVar3 & 0xff0000) >> 8 | (uVar3 & 0xff00) << 8 | uVar3 << 0x18;
    uVar1 = *(ulong *)(ptr + uVar6 + 0x10);
    this->presentation_time_ =
         uVar1 >> 0x38 | (uVar1 & 0xff000000000000) >> 0x28 | (uVar1 & 0xff0000000000) >> 0x18 |
         (uVar1 & 0xff00000000) >> 8 | (uVar1 & 0xff000000) << 8 | (uVar1 & 0xff0000) << 0x18 |
         (uVar1 & 0xff00) << 0x28 | uVar1 << 0x38;
    uVar3 = *(uint *)(ptr + uVar6 + 0x18);
    this->event_duration_ =
         uVar3 >> 0x18 | (uVar3 & 0xff0000) >> 8 | (uVar3 & 0xff00) << 8 | uVar3 << 0x18;
    uVar3 = *(uint *)(ptr + uVar6 + 0x1c);
    this->id_ = uVar3 >> 0x18 | (uVar3 & 0xff0000) >> 8 | (uVar3 & 0xff00) << 8 | uVar3 << 0x18;
    std::__cxx11::string::string(local_50,ptr + uVar6 + 0x20,&local_51);
    std::__cxx11::string::operator=((string *)&this->scheme_id_uri_,local_50);
    std::__cxx11::string::~string(local_50);
    lVar4 = uVar6 + 8 + (this->scheme_id_uri_)._M_string_length;
    std::__cxx11::string::string(local_50,ptr + lVar4 + 0x19,&local_51);
    std::__cxx11::string::operator=((string *)&this->value_,local_50);
    std::__cxx11::string::~string(local_50);
    uVar3 = (int)(this->value_)._M_string_length + (int)lVar4 + 0x1a;
  }
  for (uVar6 = (ulong)uVar3; uVar6 < data_size; uVar6 = uVar6 + 1) {
    local_50[0] = *(string *)(ptr + uVar6);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::emplace_back<unsigned_char>
              (&this->message_data_,(uchar *)local_50);
  }
  return;
}

Assistant:

void emsg::parse(const char *ptr, unsigned int data_size)
	{
		full_box::parse(ptr);
		uint64_t offset = full_box::size();
		if (version_ == 0)
		{
			scheme_id_uri_ = std::string(ptr + offset);
			//cout << "scheme_id_uri: " << scheme_id_uri << endl;
			offset = offset + scheme_id_uri_.size() + 1;
			value_ = std::string(ptr + offset);
			//cout << "value: " << value << endl;
			offset = offset + value_.size() + 1;
			timescale_ = fmp4_read_uint32(ptr + offset);
			offset += 4;
			//cout << "timescale: " << timescale << endl;
			presentation_time_delta_ = fmp4_read_uint32(ptr + offset);
			offset += 4;
			//cout << "presentation_time_delta: " << presentation_time_delta << endl;
			event_duration_ = fmp4_read_uint32(ptr + offset);
			offset += 4;
			//cout << "event_duration: " << event_duration << endl;
			id_ = fmp4_read_uint32(ptr + offset);
			//cout << "id: " << id << endl;
			offset += 4;
		}
		else
		{
			timescale_ = fmp4_read_uint32(ptr + offset);
			//cout << "timescale: " << timescale << endl;
			offset += 4;
			presentation_time_ = fmp4_read_uint64(ptr + offset);
			//cout << "presentation time: " << presentation_time << endl;
			offset += 8;
			event_duration_ = fmp4_read_uint32(ptr + offset);
			//cout << "event duration: " << event_duration << endl;
			offset += 4;
			id_ = fmp4_read_uint32(ptr + offset);
			offset += 4;
			//cout << "id: " << id << endl;
			scheme_id_uri_ = std::string(ptr + offset);
			offset = offset + scheme_id_uri_.size() + 1;
			//cout << "scheme_id_uri: " << scheme_id_uri << endl;
			value_ = std::string(ptr + offset);
			//cout << "value: " << value << endl;
			offset = offset + value_.size() + 1;
		}
		for (unsigned int i = (unsigned int)offset; i < data_size; i++)
		{
			message_data_.push_back(*(ptr + (size_t)i));
		}
	}